

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O2

DeviceType Diligent::DearchiverBase::GetArchiveDeviceType(IRenderDevice *pDevice)

{
  int iVar1;
  DeviceType DVar2;
  undefined4 extraout_var;
  char (*in_RCX) [19];
  string msg;
  
  if (pDevice == (IRenderDevice *)0x0) {
    FormatString<char[26],char[19]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x2e1f0c,in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetArchiveDeviceType",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,99);
    std::__cxx11::string::~string((string *)&msg);
  }
  iVar1 = (*(pDevice->super_IObject)._vptr_IObject[0x18])(pDevice);
  DVar2 = RenderDeviceTypeToArchiveDeviceType(*(RENDER_DEVICE_TYPE *)CONCAT44(extraout_var,iVar1));
  return DVar2;
}

Assistant:

DearchiverBase::DeviceType DearchiverBase::GetArchiveDeviceType(const IRenderDevice* pDevice)
{
    VERIFY_EXPR(pDevice != nullptr);
    const RENDER_DEVICE_TYPE Type = pDevice->GetDeviceInfo().Type;
    return RenderDeviceTypeToArchiveDeviceType(Type);
}